

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O2

int parse_commandline(int argc,char **argv,oonf_appdata *appdata,_Bool reload_only)

{
  long lVar1;
  int iVar2;
  cfg_db *pcVar3;
  oonf_subsystem *poVar4;
  cfg_db *pcVar5;
  cfg_instance *pcVar6;
  undefined8 *puVar7;
  undefined7 in_register_00000009;
  char *pcVar8;
  uint uVar9;
  avl_tree *paVar10;
  int opt_idx;
  autobuf log;
  
  pcVar3 = oonf_cfg_get_rawdb();
  _optind = 1;
  _opterr = _ignore_unknown - 1;
  abuf_init(&log);
  pcVar8 = "-hvp:ql:S:s:r:g::f:n";
  if ((int)CONCAT71(in_register_00000009,reload_only) != 0) {
    pcVar8 = "-p:l:s:r:f:n";
  }
  uVar9 = 0xffffffff;
LAB_001066c8:
  if (uVar9 != 0xffffffff) goto LAB_0010698b;
  iVar2 = getopt_long(argc,argv,pcVar8,oonf_options);
  if (iVar2 < 0) {
    uVar9 = 0xffffffff;
    for (; _optind < argc; _optind = _optind + 1) {
      if (_handle_unused_argument != (_func_int_char_ptr *)0x0) {
        (*_handle_unused_argument)(argv[_optind]);
      }
    }
LAB_0010698b:
    if (log._len != 0) {
      if (reload_only) {
        if ((log_global_mask[1] & 4) != 0) {
          oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0x26b,(void *)0x0,0,
                   "Cannot reload configuration.\n%s",log._buf);
        }
      }
      else {
        if (uVar9 == 0) {
          puVar7 = (undefined8 *)&stdout;
        }
        else {
          puVar7 = (undefined8 *)&stderr;
        }
        fputs(log._buf,(FILE *)*puVar7);
      }
    }
    abuf_free(&log);
    return uVar9;
  }
  switch(iVar2) {
  case 0x67:
    pcVar6 = oonf_cfg_get_instance();
    iVar2 = cfg_cmd_handle_get(pcVar6,pcVar3,_optarg,&log);
    uVar9 = (uint)(iVar2 != 0);
    goto LAB_001066c8;
  case 0x68:
    uVar9 = 0;
    abuf_appendf(&log,"Usage: %s [OPTION]...\n%s%s%s",*argv,appdata->help_prefix);
    goto LAB_001066c8;
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x74:
  case 0x75:
    goto switchD_00106702_caseD_69;
  case 0x6c:
    pcVar6 = oonf_cfg_get_instance();
    iVar2 = cfg_cmd_handle_load(pcVar6,pcVar3,_optarg,&log);
    break;
  case 0x70:
    poVar4 = oonf_cfg_load_subsystem(_optarg);
    uVar9 = 1;
    if (poVar4 != (oonf_subsystem *)0x0) {
      pcVar5 = oonf_cfg_get_rawdb();
      cfg_db_set_entry_ext(pcVar5,"global",0,"plugin",_optarg,1,1);
      uVar9 = 0xffffffff;
    }
    goto LAB_001066c8;
  case 0x71:
    oonf_cfg_exit();
    uVar9 = 0xffffffff;
    goto LAB_001066c8;
  case 0x72:
    pcVar6 = oonf_cfg_get_instance();
    iVar2 = cfg_cmd_handle_remove(pcVar6,pcVar3,_optarg,&log);
    break;
  case 0x73:
    pcVar6 = oonf_cfg_get_instance();
    iVar2 = cfg_cmd_handle_set(pcVar6,pcVar3,_optarg,&log);
    break;
  case 0x76:
    oonf_log_printversion(&log);
    paVar10 = &oonf_plugin_tree;
    while (paVar10 = (avl_tree *)(paVar10->list_head).next,
          (paVar10->list_head).prev != oonf_plugin_tree.list_head.prev) {
      lVar1._0_4_ = paVar10[-1].count;
      lVar1._4_1_ = paVar10[-1].allow_dups;
      lVar1._5_3_ = *(undefined3 *)&paVar10[-1].field_0x1d;
      if (lVar1 == 0) {
        abuf_appendf(&log,"Static plugin: %s\n",paVar10[-3].list_head.prev);
      }
    }
    uVar9 = 0;
    goto LAB_001066c8;
  default:
    goto switchD_00106702_default;
  }
  goto LAB_00106925;
switchD_00106702_default:
  uVar9 = 0xffffffff;
  if (iVar2 - 0x101U < 2) goto LAB_001066c8;
  uVar9 = 0xffffffff;
  if (iVar2 == 1) {
    if (_handle_unused_argument != (_func_int_char_ptr *)0x0) {
      (*_handle_unused_argument)(_optarg);
      uVar9 = 0xffffffff;
    }
    goto LAB_001066c8;
  }
  if (iVar2 != 0x53) {
    if (iVar2 == 0x100) {
      _schema_name = _optarg;
      _display_schema = 1;
    }
    else {
switchD_00106702_caseD_69:
      uVar9 = 0xffffffff;
      if ((!reload_only) && (_ignore_unknown == 0)) {
        abuf_appendf(&log,"Unknown parameter: \'%c\' (%d)\n",iVar2,iVar2);
        uVar9 = 1;
      }
    }
    goto LAB_001066c8;
  }
  pcVar6 = oonf_cfg_get_instance();
  iVar2 = cfg_cmd_handle_save(pcVar6,pcVar3,_optarg,&log);
LAB_00106925:
  uVar9 = -(uint)(iVar2 == 0) | 1;
  goto LAB_001066c8;
}

Assistant:

static int
parse_commandline(int argc, char **argv, const struct oonf_appdata *appdata __attribute((unused)), bool reload_only) {
  struct oonf_subsystem *plugin;
  const char *parameters;
  struct autobuf log;
  struct cfg_db *db;
  int opt, opt_idx, return_code;

  return_code = -1;
  db = oonf_cfg_get_rawdb();

  /* reset getopt_long */
  opt_idx = -1;
  optind = 1;
  opterr = _ignore_unknown ? 0 : -1;

  abuf_init(&log);

  if (reload_only) {
    /* only parameters that load and change configuration data */
    parameters = "-p:l:s:r:f:n";
  }
  else {
    parameters = "-hvp:ql:S:s:r:g::f:n";
  }

  while (return_code == -1 && 0 <= (opt = getopt_long(argc, argv, parameters, oonf_options, &opt_idx))) {
    switch (opt) {
      case 'h':
#if !defined(REMOVE_HELPTEXT)
        abuf_appendf(
          &log, "Usage: %s [OPTION]...\n%s%s%s", argv[0], appdata->help_prefix, help_text, appdata->help_suffix);
#endif
        return_code = 0;
        break;

      case argv_option_debug_early:
      case argv_option_ignore_unknown:
        /* ignore this here */
        break;

      case 'v':
        oonf_log_printversion(&log);
        avl_for_each_element(&oonf_plugin_tree, plugin, _node) {
          if (!oonf_subsystem_is_dynamic(plugin)) {
            abuf_appendf(&log, "Static plugin: %s\n", plugin->name);
          }
        }
        return_code = 0;
        break;
      case 'p':
        if (oonf_cfg_load_subsystem(optarg) == NULL) {
          return_code = 1;
        }
        else {
          cfg_db_add_entry(oonf_cfg_get_rawdb(), CFG_SECTION_GLOBAL, NULL, CFG_GLOBAL_PLUGIN, optarg);
        }
        break;
      case 'q':
        oonf_cfg_exit();
        break;

      case argv_option_schema:
        _schema_name = optarg;
        _display_schema = true;
        break;

      case 'l':
        if (cfg_cmd_handle_load(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'S':
        if (cfg_cmd_handle_save(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 's':
        if (cfg_cmd_handle_set(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'r':
        if (cfg_cmd_handle_remove(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'g':
        if (cfg_cmd_handle_get(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        else {
          return_code = 0;
        }
        break;
      case 1:
        /* string that is not part of an option */
        if (_handle_unused_argument) {
          _handle_unused_argument(optarg);
        }
        break;

      case '?':
      default:
        if (!(reload_only || _ignore_unknown)) {
          abuf_appendf(&log, "Unknown parameter: '%c' (%d)\n", opt, opt);
          return_code = 1;
        }
        break;
    }
  }

  while (return_code == -1 && optind < argc) {
    /* handle the end of the command line */
    if (_handle_unused_argument) {
      _handle_unused_argument(argv[optind]);
    }
    optind++;
  }

  if (abuf_getlen(&log) > 0) {
    if (reload_only) {
      OONF_WARN(LOG_MAIN, "Cannot reload configuration.\n%s", abuf_getptr(&log));
    }
    else {
      fputs(abuf_getptr(&log), return_code == 0 ? stdout : stderr);
    }
  }

  abuf_free(&log);

  return return_code;
}